

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<int,_std::allocator<int>_> *variable,string *value)

{
  char *__nptr;
  long lVar1;
  value_type_conflict1 local_2c;
  char *local_28;
  char *res;
  string *value_local;
  vector<int,_std::allocator<int>_> *variable_local;
  CommandLineArguments *this_local;
  
  local_28 = (char *)0x0;
  res = (char *)value;
  value_local = (string *)variable;
  variable_local = (vector<int,_std::allocator<int>_> *)this;
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar1 = strtol(__nptr,&local_28,10);
  local_2c = (value_type_conflict1)lVar1;
  std::vector<int,_std::allocator<int>_>::push_back(variable,&local_2c);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<int>* variable,
                                            const std::string& value)
{
  char* res = nullptr;
  variable->push_back(static_cast<int>(strtol(value.c_str(), &res, 10)));
  // if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}